

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq,ldf *data)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  _Ios_Openmode _Var5;
  size_type sVar6;
  reference ppeVar7;
  wclass *pwVar8;
  ulong uVar9;
  size_t sVar10;
  v_array<int> *this;
  int **ppiVar11;
  ostream *poVar12;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  byte *in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  size_t i;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  size_t j;
  example *ec_k;
  size_t k;
  float min_score;
  uint32_t predicted_K;
  uint32_t predicted_class;
  float loss;
  v_array<COST_SENSITIVE::wclass> costs;
  label *ld;
  example *in_stack_fffffffffffffca8;
  example *in_stack_fffffffffffffcd8;
  code *pcVar13;
  float local_2dc;
  string local_298 [32];
  ulong local_278;
  stringstream local_260 [16];
  ostream local_250;
  string local_d8 [8];
  uint32_t in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  multi_ex *in_stack_ffffffffffffff38;
  example *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 is_test;
  vw *in_stack_ffffffffffffff50;
  int *local_88;
  ulong local_78;
  ulong local_68;
  float local_60;
  uint local_5c;
  uint32_t local_58;
  float local_54;
  v_array<COST_SENSITIVE::wclass> local_50;
  undefined8 *local_30;
  long local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  byte *local_18;
  long local_10;
  long *local_8;
  
  local_30 = (undefined8 *)(in_RSI + 0x6828);
  local_50._begin = (wclass *)*local_30;
  local_50._end = *(wclass **)(in_RSI + 0x6830);
  local_50.end_array = *(wclass **)(in_RSI + 0x6838);
  local_50.erase_count = *(size_t *)(in_RSI + 0x6840);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar4 = example_is_newline(in_stack_fffffffffffffca8);
  if ((iVar4 == 0) && (bVar3 = ec_is_label_definition(in_stack_fffffffffffffcd8), !bVar3)) {
    *(long *)(*local_8 + 0x10) = *(long *)(local_10 + 0x68a0) + *(long *)(*local_8 + 0x10);
    local_54 = 0.0;
    if ((*(byte *)(local_28 + 0xbb) & 1) == 0) {
      local_58 = *(uint32_t *)(local_10 + 0x6850);
    }
    else {
      local_5c = 0;
      local_60 = 3.4028235e+38;
      for (local_68 = 0; sVar6 = std::vector<example_*,_std::allocator<example_*>_>::size(local_20),
          local_68 < sVar6; local_68 = local_68 + 1) {
        ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_68);
        if ((*ppeVar7)->partial_prediction < local_60) {
          local_60 = (*ppeVar7)->partial_prediction;
          local_5c = (uint)local_68;
        }
      }
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (local_20,(ulong)local_5c);
      pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar7)->l).simple,0);
      local_58 = pwVar8->class_index;
    }
    uVar9 = (*(code *)PTR_test_label_00492ce0)(local_10 + 0x6828);
    if ((uVar9 & 1) == 0) {
      local_78 = 0;
      while ((sVar10 = v_array<COST_SENSITIVE::wclass>::size(&local_50), local_78 < sVar10 &&
             ((*local_18 & 1) == 0))) {
        pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_78);
        if (local_58 == pwVar8->class_index) {
          pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_78);
          local_54 = pwVar8->x;
          *local_18 = 1;
        }
        local_78 = local_78 + 1;
      }
      *(double *)(*local_8 + 0x40) = (double)local_54 + *(double *)(*local_8 + 0x40);
      *(double *)(*local_8 + 0x48) = (double)local_54 + *(double *)(*local_8 + 0x48);
    }
    this = (v_array<int> *)(local_8 + 0x6a2);
    ppiVar11 = v_array<int>::begin(this);
    local_88 = *ppiVar11;
    ppiVar11 = v_array<int>::end(this);
    piVar1 = *ppiVar11;
    for (; is_test = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38), local_88 != piVar1;
        local_88 = local_88 + 1) {
      if ((*(byte *)(local_28 + 0xbb) & 1) == 0) {
        local_2dc = (float)*(uint *)(local_10 + 0x6850);
      }
      else {
        local_2dc = *(float *)(local_10 + 0x6850);
      }
      in_stack_ffffffffffffff48 = *(undefined8 *)(local_10 + 0x6878);
      in_stack_ffffffffffffff50 = *(vw **)(local_10 + 0x6880);
      (*(code *)local_8[0x6a7])(local_2dc,0,*local_88);
    }
    if (0 < (int)local_8[0x6a6]) {
      std::__cxx11::string::string(local_d8);
      _Var5 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_260,local_d8,_Var5);
      local_278 = 0;
      while( true ) {
        uVar9 = local_278;
        sVar10 = v_array<COST_SENSITIVE::wclass>::size(&local_50);
        is_test = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
        if (sVar10 <= uVar9) break;
        if (local_278 != 0) {
          std::operator<<(&local_250,' ');
        }
        pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_278);
        poVar12 = (ostream *)std::ostream::operator<<(&local_250,pwVar8->class_index);
        poVar12 = std::operator<<(poVar12,':');
        pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_278);
        std::ostream::operator<<(poVar12,pwVar8->partial_prediction);
        local_278 = local_278 + 1;
      }
      pcVar13 = (code *)local_8[0x6a8];
      lVar2 = local_8[0x6a6];
      std::__cxx11::stringstream::str();
      (*pcVar13)((int)lVar2,local_298);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::stringstream::~stringstream(local_260);
      std::__cxx11::string::~string(local_d8);
    }
    (*(code *)PTR_test_label_00492ce0)(local_10 + 0x6828);
    COST_SENSITIVE::print_update
              (in_stack_ffffffffffffff50,(bool)is_test,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37,in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq, ldf& data)
{
  label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec))
    return;
  if (ec_is_label_definition(ec))
    return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class;
  if (data.is_probabilities)
  {
    // predicted_K was already computed in do_actual_learning(),
    // but we cannot store it in ec.pred union because we store ec.pred.prob there.
    // So we must compute it again.
    uint32_t predicted_K = 0;
    float min_score = FLT_MAX;
    for (size_t k = 0; k < ec_seq->size(); k++)
    {
      example* ec_k = (*ec_seq)[k];
      if (ec_k->partial_prediction < min_score)
      {
        min_score = ec_k->partial_prediction;
        predicted_K = (uint32_t)k;
      }
    }
    predicted_class = (*ec_seq)[predicted_K]->l.cs.costs[0].class_index;
  }
  else
    predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j = 0; j < costs.size(); j++)
    {
      if (hit_loss)
        break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, data.is_probabilities ? ec.pred.prob : (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}